

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFModelExport.cpp
# Opt level: O0

bool iDynTree::exportLink(Link *link,string *linkName,Model *model,xmlNodePtr parent_element)

{
  bool bVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  size_type __n;
  vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
  *pvVar4;
  const_reference pvVar5;
  size_type sVar6;
  undefined8 in_RCX;
  string *in_RDX;
  SolidShape *exportedShape_1;
  uint shapeIdx_1;
  SolidShape *exportedShape;
  uint shapeIdx;
  LinkIndex linkIndex;
  xmlNodePtr link_xml;
  bool ok;
  xmlNodePtr in_stack_000001d8;
  SpatialInertia *in_stack_000001e0;
  xmlNodePtr in_stack_000003f8;
  exportSolidShapePropertyType in_stack_00000404;
  SolidShape *in_stack_00000408;
  uint local_4c;
  uint local_3c;
  
  uVar2 = xmlNewChild(in_RCX,0,"link");
  uVar3 = std::__cxx11::string::c_str();
  xmlNewProp(uVar2,"name",uVar3);
  iDynTree::Link::getInertia();
  bVar1 = exportInertial(in_stack_000001e0,in_stack_000001d8);
  __n = iDynTree::Model::getLinkIndex(in_RDX);
  local_3c = 0;
  while( true ) {
    iDynTree::Model::visualSolidShapes();
    pvVar4 = (vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
              *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
    pvVar5 = std::
             vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
             ::operator[](pvVar4,__n);
    sVar6 = std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::size
                      (pvVar5);
    if (sVar6 <= local_3c) break;
    iDynTree::Model::visualSolidShapes();
    pvVar4 = (vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
              *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
    pvVar5 = std::
             vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
             ::operator[](pvVar4,__n);
    std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::operator[]
              (pvVar5,(ulong)local_3c);
    exportSolidShape(in_stack_00000408,in_stack_00000404,in_stack_000003f8);
    local_3c = local_3c + 1;
  }
  local_4c = 0;
  while( true ) {
    iDynTree::Model::collisionSolidShapes();
    pvVar4 = (vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
              *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
    pvVar5 = std::
             vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
             ::operator[](pvVar4,__n);
    sVar6 = std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::size
                      (pvVar5);
    if (sVar6 <= local_4c) break;
    iDynTree::Model::collisionSolidShapes();
    pvVar4 = (vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
              *)iDynTree::ModelSolidShapes::getLinkSolidShapes();
    pvVar5 = std::
             vector<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>,_std::allocator<std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>_>_>
             ::operator[](pvVar4,__n);
    std::vector<iDynTree::SolidShape_*,_std::allocator<iDynTree::SolidShape_*>_>::operator[]
              (pvVar5,(ulong)local_4c);
    exportSolidShape(in_stack_00000408,in_stack_00000404,in_stack_000003f8);
    local_4c = local_4c + 1;
  }
  return bVar1;
}

Assistant:

bool exportLink(const Link &link, const std::string linkName, const Model& model, xmlNodePtr parent_element)
{
    bool ok = true;
    xmlNodePtr link_xml = xmlNewChild(parent_element, NULL, BAD_CAST "link", NULL);
    xmlNewProp(link_xml, BAD_CAST "name", BAD_CAST linkName.c_str());

    ok = ok && exportInertial(link.getInertia(), link_xml);

    LinkIndex linkIndex = model.getLinkIndex(linkName);

    // Export visual shapes
    for(unsigned int shapeIdx=0; shapeIdx < model.visualSolidShapes().getLinkSolidShapes()[linkIndex].size(); shapeIdx++) {
        SolidShape * exportedShape = model.visualSolidShapes().getLinkSolidShapes()[linkIndex][shapeIdx];
        exportSolidShape(exportedShape, VISUAL, link_xml);
    }

    // Export collision shapes
    for(unsigned int shapeIdx=0; shapeIdx < model.collisionSolidShapes().getLinkSolidShapes()[linkIndex].size(); shapeIdx++) {
        // Clone the shape
        SolidShape * exportedShape = model.collisionSolidShapes().getLinkSolidShapes()[linkIndex][shapeIdx];
        exportSolidShape(exportedShape, COLLISION, link_xml);
    }

    return ok;
}